

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall CS248::DynamicScene::XFormWidget::drawRotateHandles(XFormWidget *this)

{
  double dVar1;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    dVar9 = (this->center).x;
    dVar10 = (this->center).y;
    dVar3 = (this->bounds).max.x - (this->bounds).min.x;
    dVar5 = (this->bounds).max.y - (this->bounds).min.y;
    dVar1 = (this->center).z;
    dVar20 = (this->bounds).max.z - (this->bounds).min.z;
    dVar3 = SQRT(dVar20 * dVar20 + dVar3 * dVar3 + dVar5 * dVar5) * 0.5;
    glLineWidth(0x41000000);
    glBegin(1);
    uVar18 = 0;
    do {
      uVar19 = uVar18 + 1;
      uVar15 = 0;
      if (uVar19 != 3) {
        uVar15 = uVar19 & 0xffffffff;
      }
      pVVar2 = (this->axes).super__Vector_base<CS248::Vector3D,_std::allocator<CS248::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar5 = pVVar2[uVar15].z;
      uVar17 = (ulong)((int)uVar18 - 1);
      if (uVar18 == 0) {
        uVar17 = 2;
      }
      dVar11 = pVVar2[uVar15].x;
      dVar12 = pVVar2[uVar15].y;
      dVar13 = pVVar2[uVar17].x;
      dVar14 = pVVar2[uVar17].y;
      dVar20 = pVVar2[uVar17].z;
      glColor4ubv((this->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      dVar6 = 0.0;
      iVar16 = 1;
      do {
        dVar21 = dVar6 * 6.283185307179586 * 0.015625;
        dVar6 = dVar6 + 1.0;
        dVar7 = (double)iVar16 * 6.283185307179586 * 0.015625;
        dVar4 = cos(dVar21);
        dVar21 = sin(dVar21);
        local_38 = (dVar5 * dVar4 - dVar20 * dVar21) * dVar3 + dVar1;
        dVar8 = (dVar4 * dVar12 - dVar21 * dVar14) * dVar3 + dVar10;
        local_48._8_4_ = SUB84(dVar8,0);
        local_48._0_8_ = (dVar4 * dVar11 - dVar21 * dVar13) * dVar3 + dVar9;
        local_48._12_4_ = (int)((ulong)dVar8 >> 0x20);
        dVar4 = cos(dVar7);
        dVar21 = sin(dVar7);
        local_58 = (dVar5 * dVar4 - dVar20 * dVar21) * dVar3 + dVar1;
        dVar7 = (dVar4 * dVar12 - dVar21 * dVar14) * dVar3 + dVar10;
        local_68._8_4_ = SUB84(dVar7,0);
        local_68._0_8_ = (dVar4 * dVar11 - dVar21 * dVar13) * dVar3 + dVar9;
        local_68._12_4_ = (int)((ulong)dVar7 >> 0x20);
        glVertex3dv(local_48);
        glVertex3dv(local_68);
        iVar16 = iVar16 + 1;
      } while (iVar16 != 0x41);
      uVar18 = uVar19;
    } while (uVar19 != 3);
    glEnd();
    drawCenterHandle(this);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawRotateHandles() const {
  const double boxSize = .2;
  const int nSides = 64;

  if (target.object == nullptr) return;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = 0; i < 3; i++) {
    Vector3D e1 = axes[(i + 1) % 3];
    Vector3D e2 = axes[(i + 2) % 3];

    glColor4ubv(&axisColors[i][0]);

    for (int j = 0; j < nSides; j++) {
      double theta1 = 2. * M_PI * (double)(j + 0) / (double)nSides;
      double theta2 = 2. * M_PI * (double)(j + 1) / (double)nSides;

      Vector3D q1 = c + r * (cos(theta1) * e1 - sin(theta1) * e2);
      Vector3D q2 = c + r * (cos(theta2) * e1 - sin(theta2) * e2);

      glVertex3dv(&q1.x);
      glVertex3dv(&q2.x);
    }
  }
  glEnd();

  drawCenterHandle();

  glLineWidth(1.);
}